

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByCamelcaseName(Descriptor *this,ConstStringParam key)

{
  void *pvVar1;
  pointer pcVar2;
  size_t size;
  second_type pFVar3;
  FieldDescriptor *pFVar4;
  first_type local_40;
  
  pvVar1 = *(void **)(*(long *)(this + 0x10) + 0x80);
  pcVar2 = (key->_M_dataplus)._M_p;
  size = key->_M_string_length;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  local_40.first = pvVar1;
  std::
  call_once<void(&)(google::protobuf::FileDescriptorTables_const*),google::protobuf::FileDescriptorTables_const*>
            ((once_flag *)((long)pvVar1 + 0xc0),
             FileDescriptorTables::FieldsByCamelcaseNamesLazyInitStatic,
             (FileDescriptorTables **)&local_40);
  local_40.first = this;
  local_40.second.ptr_ = pcVar2;
  local_40.second.length_ = size;
  pFVar3 = FindPtrOrNull<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                     ((unordered_map<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::equal_to<std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)((long)pvVar1 + 0x80),&local_40);
  if (pFVar3 == (second_type)0x0) {
    pFVar4 = (FieldDescriptor *)0x0;
  }
  else {
    pFVar4 = (FieldDescriptor *)0x0;
    if (((byte)pFVar3[1] & 8) == 0) {
      pFVar4 = pFVar3;
    }
  }
  return pFVar4;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByCamelcaseName(
    ConstStringParam key) const {
  const FieldDescriptor* result =
      file()->tables_->FindFieldByCamelcaseName(this, key);
  if (result == nullptr || result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}